

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O3

bool CombinePSBTs(PartiallySignedTransaction *out,
                 vector<PartiallySignedTransaction,_std::allocator<PartiallySignedTransaction>_>
                 *psbtxs)

{
  long lVar1;
  pointer __other;
  PartiallySignedTransaction *pPVar2;
  bool bVar3;
  PartiallySignedTransaction *psbt;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __other = (psbtxs->
            super__Vector_base<PartiallySignedTransaction,_std::allocator<PartiallySignedTransaction>_>
            )._M_impl.super__Vector_impl_data._M_start;
  std::_Optional_payload_base<CMutableTransaction>::_M_copy_assign
            ((_Optional_payload_base<CMutableTransaction> *)out,
             (_Optional_payload_base<CMutableTransaction> *)__other);
  std::
  _Rb_tree<KeyOriginInfo,_std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>,_std::_Select1st<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
  ::operator=(&(out->m_xpubs)._M_t,&(__other->m_xpubs)._M_t);
  std::vector<PSBTInput,_std::allocator<PSBTInput>_>::operator=(&out->inputs,&__other->inputs);
  std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>::operator=(&out->outputs,&__other->outputs);
  std::
  _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::operator=(&(out->unknown)._M_t,&(__other->unknown)._M_t);
  (out->m_version).super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (__other->m_version).super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>;
  std::
  _Rb_tree<PSBTProprietary,_PSBTProprietary,_std::_Identity<PSBTProprietary>,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
  ::operator=(&(out->m_proprietary)._M_t,&(__other->m_proprietary)._M_t);
  psbt = (psbtxs->
         super__Vector_base<PartiallySignedTransaction,_std::allocator<PartiallySignedTransaction>_>
         )._M_impl.super__Vector_impl_data._M_start;
  do {
    psbt = psbt + 1;
    pPVar2 = (psbtxs->
             super__Vector_base<PartiallySignedTransaction,_std::allocator<PartiallySignedTransaction>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (psbt == pPVar2) break;
    bVar3 = PartiallySignedTransaction::Merge(out,psbt);
  } while (bVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return psbt == pPVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CombinePSBTs(PartiallySignedTransaction& out, const std::vector<PartiallySignedTransaction>& psbtxs)
{
    out = psbtxs[0]; // Copy the first one

    // Merge
    for (auto it = std::next(psbtxs.begin()); it != psbtxs.end(); ++it) {
        if (!out.Merge(*it)) {
            return false;
        }
    }
    return true;
}